

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

bool __thiscall
Lib::
FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:750:15),_false>
::hasNext(FilteredIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:750:15),_false>
          *this)

{
  bool bVar1;
  long in_RDI;
  _ElementType next;
  InductionContext *in_stack_fffffffffffffe68;
  InductionContext *this_00;
  __doDeletion<false> local_16d;
  uint local_16c;
  InductionContext *in_stack_fffffffffffffe98;
  anon_class_8_1_705f00f1_for__func *in_stack_fffffffffffffea0;
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  *in_stack_fffffffffffffeb8;
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
  *in_stack_fffffffffffffec8;
  InductionContext local_b0 [2];
  byte local_1;
  
  bVar1 = OptionBase<Inferences::InductionContext>::isSome
                    ((OptionBase<Inferences::InductionContext> *)(in_RDI + 0x48));
  if (bVar1) {
    local_1 = 1;
  }
  else {
    do {
      bVar1 = FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
              ::hasNext(in_stack_fffffffffffffeb8);
      if (!bVar1) {
        local_1 = 0;
        break;
      }
      this_00 = local_b0;
      FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/Induction.cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
      ::next(in_stack_fffffffffffffec8);
      move_if_value<Inferences::InductionContext,_true>(in_stack_fffffffffffffe68);
      Inferences::InductionContext::~InductionContext(this_00);
      bVar1 = anon_class_8_1_705f00f1_for__func::operator()
                        (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      if (bVar1) {
        move_if_value<Inferences::InductionContext,_true>(in_stack_fffffffffffffe68);
        Option<Inferences::InductionContext>::OptionBase
                  ((Option<Inferences::InductionContext> *)this_00,in_stack_fffffffffffffe68);
        Option<Inferences::InductionContext>::operator=
                  ((Option<Inferences::InductionContext> *)this_00,
                   (Option<Inferences::InductionContext> *)in_stack_fffffffffffffe68);
        Option<Inferences::InductionContext>::~Option
                  ((Option<Inferences::InductionContext> *)0x7d967c);
        Inferences::InductionContext::~InductionContext(this_00);
        local_1 = 1;
      }
      else {
        __doDeletion<false>::operator()
                  (&local_16d,
                   (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<std::pair<std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>,_Lib::VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>,_Inferences::InductionContextFn,_Lib::VirtualIterator<Inferences::InductionContext>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_Induction_cpp:746:16),_Lib::VirtualIterator<Inferences::InductionContext>_>_>
                    *)(in_RDI + 8));
      }
      local_16c = (uint)bVar1;
      Inferences::InductionContext::~InductionContext(this_00);
    } while (local_16c == 0);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool hasNext()
  {
    if(_next.isSome()) {
      return true;
    }
    while(_inn.hasNext()) {
      OWN_ELEMENT_TYPE next = move_if_value<OWN_ELEMENT_TYPE>(_inn.next());
      if(_func(next)) {
        _next = Option<OWN_ELEMENT_TYPE>(move_if_value<OWN_ELEMENT_TYPE>(next));
        return true;
      } else {
        __doDeletion<deleteFilteredOut>{}(_inn);
      }
    }
    return false;
  }